

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_forcingstep.c
# Opt level: O3

int forcingStep_Reset(ARKodeMem ark_mem,sunrealtype tR,N_Vector yR)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int error_code;
  char *msgfmt;
  
  puVar1 = (undefined8 *)ark_mem->step_mem;
  if (puVar1 == (undefined8 *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar3 = -0x15;
    error_code = -0x15;
    iVar2 = 0x20;
  }
  else {
    iVar2 = SUNStepper_Reset(*puVar1);
    if (iVar2 == 0) {
      iVar2 = SUNStepper_Reset(tR,puVar1[1],yR);
      if (iVar2 == 0) {
        return 0;
      }
      msgfmt = "Resetting the second partition SUNStepper failed";
      iVar3 = -0x33;
      error_code = -0x33;
      iVar2 = 0x85;
    }
    else {
      msgfmt = "Resetting the first partition SUNStepper failed";
      iVar3 = -0x33;
      error_code = -0x33;
      iVar2 = 0x7d;
    }
  }
  arkProcessError(ark_mem,error_code,iVar2,"forcingStep_Reset",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_forcingstep.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

static int forcingStep_Reset(ARKodeMem ark_mem, sunrealtype tR, N_Vector yR)
{
  ARKodeForcingStepMem step_mem = NULL;
  int retval = forcingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  SUNErrCode err = SUNStepper_Reset(step_mem->stepper[0], tR, yR);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Resetting the first partition SUNStepper failed");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_Reset(step_mem->stepper[1], tR, yR);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Resetting the second partition SUNStepper failed");
    return ARK_SUNSTEPPER_ERR;
  }

  return ARK_SUCCESS;
}